

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O2

void SerializeHDKeypaths<DataStream>
               (DataStream *s,
               map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
               *hd_keypaths,CompactSizeWriter type)

{
  undefined1 uVar1;
  KeyOriginInfo hd_keypath;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  char *pcVar4;
  long in_FS_OFFSET;
  undefined8 uStack_78;
  Span<const_unsigned_char> local_70;
  CompactSizeWriter type_local;
  KeyOriginInfo local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var3 = (hd_keypaths->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  type_local.n = type.n;
  p_Var2 = (_Rb_tree_node_base *)CONCAT44(local_70.m_data._4_4_,local_70.m_data._0_4_);
  do {
    if ((_Rb_tree_header *)p_Var3 == &(hd_keypaths->_M_t)._M_impl.super__Rb_tree_header) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
LAB_0065bdf5:
      local_70.m_data = (uchar *)p_Var2;
      __stack_chk_fail();
    }
    local_70.m_data = (uchar *)(p_Var3 + 1);
    uVar1 = (undefined1)p_Var3[1]._M_color;
    if ((uVar1 & 0xfe) == 2) {
      local_70.m_size = 0x21;
    }
    else {
      if ((7 < (byte)uVar1) || ((0xd0U >> ((byte)uVar1 & 0x1f) & 1) == 0)) {
        local_70.m_data = (uchar *)p_Var2;
        pcVar4 = (char *)__cxa_allocate_exception(0x20);
        local_70.m_size = std::iostream_category();
        local_70.m_data._0_4_ = 1;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar4,(error_code *)"Invalid CPubKey being serialized");
        p_Var2 = (_Rb_tree_node_base *)CONCAT44(local_70.m_data._4_4_,local_70.m_data._0_4_);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0065bdf5;
      }
      if ((byte)(uVar1 - 4) < 4) {
        local_70.m_size = *(size_t *)(&DAT_00b5ace0 + (ulong)(byte)(uVar1 - 4) * 8);
      }
      else {
        local_70.m_size = 0;
      }
    }
    SerializeToVector<DataStream,CompactSizeWriter,Span<unsigned_char_const>>
              (s,&type_local,&local_70);
    KeyOriginInfo::KeyOriginInfo(&local_58,(KeyOriginInfo *)&p_Var3[3]._M_parent);
    hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = local_70.m_data._0_4_;
    hd_keypath._0_8_ = uStack_78;
    hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = local_70.m_data._4_4_;
    hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_70.m_size;
    hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)type_local.n;
    SerializeHDKeypath<DataStream>(s,hd_keypath);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&local_58.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    p_Var2 = (_Rb_tree_node_base *)local_70.m_data;
  } while( true );
}

Assistant:

void SerializeHDKeypaths(Stream& s, const std::map<CPubKey, KeyOriginInfo>& hd_keypaths, CompactSizeWriter type)
{
    for (const auto& keypath_pair : hd_keypaths) {
        if (!keypath_pair.first.IsValid()) {
            throw std::ios_base::failure("Invalid CPubKey being serialized");
        }
        SerializeToVector(s, type, Span{keypath_pair.first});
        SerializeHDKeypath(s, keypath_pair.second);
    }
}